

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cxx
# Opt level: O0

void __thiscall Matrix::Matrix(Matrix *this,int dimensions,int *sizes)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  int *piVar3;
  int local_38;
  int i;
  allocator<char> local_21;
  int *local_20;
  int *sizes_local;
  Matrix *pMStack_10;
  int dimensions_local;
  Matrix *this_local;
  
  local_20 = sizes;
  sizes_local._4_4_ = dimensions;
  pMStack_10 = this;
  Physical::Physical(&this->super_Physical);
  (this->super_Physical)._vptr_Physical = (_func_int **)&PTR__Matrix_0018f6e8;
  boost::shared_array<double>::shared_array(&this->matrixParent);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->sMatrixName,"data",&local_21);
  std::allocator<char>::~allocator(&local_21);
  this->nMatrixDimension = sizes_local._4_4_;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)this->nMatrixDimension;
  uVar2 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  piVar3 = (int *)operator_new__(uVar2);
  this->pSize = piVar3;
  for (local_38 = 0; local_38 < this->nMatrixDimension; local_38 = local_38 + 1) {
    this->pSize[local_38] = local_20[local_38];
  }
  this->bReference = false;
  init(this,(EVP_PKEY_CTX *)0x1);
  return;
}

Assistant:

Matrix::Matrix(int dimensions, int* sizes) : sMatrixName("data") 
 { 
	nMatrixDimension = dimensions;
	pSize = new int[nMatrixDimension];
	for(int i=0; i<nMatrixDimension; i++)
		pSize[i] = sizes[i];
	bReference = false;
	init();
}